

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DWallScrollInterpolation::Destroy(DWallScrollInterpolation *this)

{
  DWallScrollInterpolation *this_local;
  
  if (this->side != (side_t *)0x0) {
    TObjPtr<DInterpolation>::operator=
              (&this->side->textures[this->part].interpolation,(DInterpolation *)0x0);
    this->side = (side_t *)0x0;
  }
  DInterpolation::Destroy(&this->super_DInterpolation);
  return;
}

Assistant:

void DWallScrollInterpolation::Destroy()
{
	if (side != nullptr)
	{
		side->textures[part].interpolation = nullptr;
		side = nullptr;
	}
	Super::Destroy();
}